

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O0

void get_msurf_descriptors_rounding_unroll_2_24_True_winner
               (integral_image *iimage,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points)

{
  vector<interest_point,_std::allocator<interest_point>_> *pvVar1;
  vector<interest_point,_std::allocator<interest_point>_> *in_RSI;
  size_type in_RDI;
  size_t i;
  interest_point *in_stack_00000678;
  integral_image *in_stack_00000680;
  vector<interest_point,_std::allocator<interest_point>_> *this;
  vector<interest_point,_std::allocator<interest_point>_> *local_18;
  
  local_18 = (vector<interest_point,_std::allocator<interest_point>_> *)0x0;
  while( true ) {
    this = local_18;
    pvVar1 = (vector<interest_point,_std::allocator<interest_point>_> *)
             std::vector<interest_point,_std::allocator<interest_point>_>::size(in_RSI);
    if (pvVar1 <= this) break;
    std::vector<interest_point,_std::allocator<interest_point>_>::at(this,in_RDI);
    get_msurf_descriptor_rounding_unroll_2_24_True_winner(in_stack_00000680,in_stack_00000678);
    local_18 = (vector<interest_point,_std::allocator<interest_point>_> *)
               ((long)&(local_18->
                       super__Vector_base<interest_point,_std::allocator<interest_point>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  return;
}

Assistant:

void get_msurf_descriptors_rounding_unroll_2_24_True_winner(struct integral_image* iimage, std::vector<struct interest_point> *interest_points) {
    for (size_t i=0; i<interest_points->size(); ++i) {
        get_msurf_descriptor_rounding_unroll_2_24_True_winner(iimage, &interest_points->at(i));
    }
}